

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf.cpp
# Opt level: O1

string * __thiscall
duckdb::Leaf::DeprecatedVerifyAndToString_abi_cxx11_
          (string *__return_storage_ptr__,Leaf *this,ART *art,Node *node,bool only_verify)

{
  byte bVar1;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  ulong uVar3;
  bool bVar4;
  string *psVar5;
  uint uVar6;
  type paVar7;
  pointer this_00;
  data_ptr_t pdVar8;
  long *plVar9;
  undefined8 *puVar10;
  ulong uVar11;
  long *plVar12;
  _func_int **pp_Var13;
  ulong uVar14;
  uint uVar15;
  byte *pbVar16;
  ulong __val;
  string str;
  string __str_1;
  string __str;
  long *local_d8;
  long local_c8;
  long lStack_c0;
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  byte *local_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  undefined4 local_6c;
  Leaf *local_68;
  string *local_60;
  idx_t local_58;
  char *local_50 [2];
  char local_40 [16];
  
  local_6c = SUB84(node,0);
  local_b8 = local_a8;
  local_68 = this;
  local_60 = __return_storage_ptr__;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8);
  pp_Var13 = (art->super_BoundIndex).super_Index._vptr_Index;
  if ((ulong)pp_Var13 >> 0x38 != 0) {
    local_68 = (Leaf *)local_68[8].row_ids;
    do {
      paVar7 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*((shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                            *)local_68);
      _Var2._M_head_impl =
           paVar7->_M_elems[1].
           super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
           .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
      plVar9 = *(long **)(*(long *)&((_Var2._M_head_impl)->buffers)._M_h +
                         (((ulong)pp_Var13 & 0xffffffff) %
                         *(size_type *)((long)&(_Var2._M_head_impl)->buffers + 8)) * 8);
      for (plVar12 = (long *)*plVar9; ((ulong)pp_Var13 & 0xffffffff) != plVar12[1];
          plVar12 = (long *)*plVar12) {
        plVar9 = plVar12;
      }
      this_00 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                              *)(*plVar9 + 0x10));
      pdVar8 = FixedSizeBuffer::Get(this_00,false);
      local_98 = pdVar8 + (ulong)((uint)((ulong)pp_Var13 >> 0x20) & 0xffffff) *
                          (_Var2._M_head_impl)->segment_size;
      local_58 = (_Var2._M_head_impl)->bitmask_offset;
      bVar1 = local_98[local_58];
      uVar15 = 3 - (bVar1 < 100);
      if (bVar1 < 10) {
        uVar15 = 1;
      }
      local_50[0] = local_40;
      ::std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar15);
      ::std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0],uVar15,(uint)bVar1);
      plVar9 = (long *)::std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x13b2570);
      plVar12 = plVar9 + 2;
      if ((long *)*plVar9 == plVar12) {
        local_80 = *plVar12;
        lStack_78 = plVar9[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar12;
        local_90 = (long *)*plVar9;
      }
      local_88 = plVar9[1];
      *plVar9 = (long)plVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)::std::__cxx11::string::append((char *)&local_90);
      plVar12 = plVar9 + 2;
      if ((long *)*plVar9 == plVar12) {
        local_c8 = *plVar12;
        lStack_c0 = plVar9[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *plVar12;
        local_d8 = (long *)*plVar9;
      }
      *plVar9 = (long)plVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_d8);
      if (local_d8 != &local_c8) {
        operator_delete(local_d8);
      }
      pbVar16 = local_98;
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      pbVar16 = pbVar16 + local_58;
      if (*pbVar16 != 0) {
        uVar14 = 0;
        local_98 = pbVar16;
        do {
          uVar3 = *(ulong *)(pbVar16 + uVar14 * 8 + 8);
          __val = -uVar3;
          if (0 < (long)uVar3) {
            __val = uVar3;
          }
          uVar15 = 1;
          if (9 < __val) {
            uVar11 = __val;
            uVar6 = 4;
            do {
              uVar15 = uVar6;
              if (uVar11 < 100) {
                uVar15 = uVar15 - 2;
                goto LAB_00c24b2d;
              }
              if (uVar11 < 1000) {
                uVar15 = uVar15 - 1;
                goto LAB_00c24b2d;
              }
              if (uVar11 < 10000) goto LAB_00c24b2d;
              bVar4 = 99999 < uVar11;
              uVar11 = uVar11 / 10000;
              uVar6 = uVar15 + 4;
            } while (bVar4);
            uVar15 = uVar15 + 1;
          }
LAB_00c24b2d:
          local_90 = &local_80;
          ::std::__cxx11::string::_M_construct
                    ((ulong)&local_90,(char)uVar15 - (char)((long)uVar3 >> 0x3f));
          ::std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)((long)local_90 - ((long)uVar3 >> 0x3f)),uVar15,__val);
          puVar10 = (undefined8 *)::std::__cxx11::string::append((char *)&local_90);
          plVar9 = puVar10 + 2;
          if ((long *)*puVar10 == plVar9) {
            local_c8 = *plVar9;
            lStack_c0 = puVar10[3];
            local_d8 = &local_c8;
          }
          else {
            local_c8 = *plVar9;
            local_d8 = (long *)*puVar10;
          }
          *puVar10 = plVar9;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_d8);
          if (local_d8 != &local_c8) {
            operator_delete(local_d8);
          }
          pbVar16 = local_98;
          if (local_90 != &local_80) {
            operator_delete(local_90);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < *pbVar16);
      }
      ::std::__cxx11::string::append((char *)&local_b8);
      pp_Var13 = *(_func_int ***)(pbVar16 + 0x28);
    } while ((_func_int **)0xffffffffffffff < pp_Var13);
  }
  psVar5 = local_60;
  (local_60->_M_dataplus)._M_p = (pointer)&local_60->field_2;
  if ((char)local_6c == '\0') {
    ::std::__cxx11::string::_M_construct<char*>((string *)local_60,local_b8,local_b8 + local_b0);
  }
  else {
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_60,anon_var_dwarf_643533f + 9)
    ;
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  return psVar5;
}

Assistant:

string Leaf::DeprecatedVerifyAndToString(ART &art, const Node &node, const bool only_verify) {
	D_ASSERT(node.GetType() == LEAF);

	string str = "";
	reference<const Node> ref(node);

	while (ref.get().HasMetadata()) {
		auto &leaf = Node::Ref<const Leaf>(art, ref, LEAF);
		D_ASSERT(leaf.count <= LEAF_SIZE);

		str += "Leaf [count: " + to_string(leaf.count) + ", row IDs: ";
		for (uint8_t i = 0; i < leaf.count; i++) {
			str += to_string(leaf.row_ids[i]) + "-";
		}
		str += "] ";
		ref = leaf.ptr;
	}

	return only_verify ? "" : str;
}